

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Node * CleanTree(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *local_20;
  Node *child;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (node->content != (Node *)0x0) {
    local_20 = node->content;
    while ((local_20 != (Node *)0x0 && (pNVar1 = CleanTree(doc,local_20), pNVar1 != (Node *)0x0))) {
      local_20 = pNVar1->next;
    }
  }
  pNVar1 = CleanNode(doc,node);
  return pNVar1;
}

Assistant:

static Node* CleanTree( TidyDocImpl* doc, Node *node )
{
    if (node->content)
    {
        Node *child;
        for (child = node->content; child != NULL; child = child->next)
        {
            child = CleanTree( doc, child );
            if ( !child )
                break;
        }
    }

    return CleanNode( doc, node );
}